

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json.c
# Opt level: O0

void json_print_anydata(lyout *out,int level,lyd_node *node,int toplevel,int options)

{
  int iVar1;
  lys_module *plVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  int local_4c;
  lyd_node_anydata *any;
  char *schema;
  int options_local;
  int toplevel_local;
  lyd_node *node_local;
  int level_local;
  lyout *out_local;
  
  any = (lyd_node_anydata *)0x0;
  if (((toplevel == 0) && (node->parent != (lyd_node *)0x0)) &&
     (iVar1 = nscmp(node,node->parent), iVar1 == 0)) {
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    pcVar5 = "";
    if (level != 0) {
      pcVar5 = "\n";
    }
    ly_print(out,"%*s\"%s\":%s{%s",(ulong)(uint)(level << 1),"",node->schema->name,pcVar3,pcVar5);
  }
  else {
    plVar2 = lys_node_module(node->schema);
    any = (lyd_node_anydata *)plVar2->name;
    pcVar5 = "";
    if (level != 0) {
      pcVar5 = " ";
    }
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = "\n";
    }
    ly_print(out,"%*s\"%s:%s\":%s{%s",(ulong)(uint)(level << 1),"",any,node->schema->name,pcVar5,
             pcVar3);
  }
  node_local._4_4_ = level;
  if (level != 0) {
    node_local._4_4_ = level + 1;
  }
  if (*(int *)&node->child == 2) {
    if (node[1].schema != (lys_node *)0x0) {
      pcVar3 = "";
      if (node_local._4_4_ != 0) {
        pcVar3 = "\n";
      }
      ly_print(out,"%*s%s%s",(ulong)(uint)(node_local._4_4_ << 1),"",node[1].schema,pcVar3,pcVar5);
    }
  }
  else if (*(int *)&node->child == 0x10) {
    json_print_nodes(out,node_local._4_4_,(lyd_node *)node[1].schema,1,0,options & 2U | 1);
  }
  else if ('\0' < ly_log_level) {
    ly_log(LY_LLWRN,"Unable to print anydata content (type %d) as JSON.",
           (ulong)*(uint *)&node->child);
  }
  if (node->attr != (lyd_attr *)0x0) {
    if (any == (lyd_node_anydata *)0x0) {
      pcVar3 = "";
      if (node_local._4_4_ != 0) {
        pcVar3 = "\n";
      }
      pcVar5 = "";
      if (node_local._4_4_ != 0) {
        pcVar5 = " ";
      }
      pcVar4 = "";
      if (node_local._4_4_ != 0) {
        pcVar4 = "\n";
      }
      ly_print(out,",%s%*s\"@%s\":%s{%s",pcVar3,(ulong)(uint)(node_local._4_4_ << 1),"",
               node->schema->name,pcVar5,pcVar4);
    }
    else {
      pcVar3 = "";
      if (node_local._4_4_ != 0) {
        pcVar3 = "\n";
      }
      pcVar5 = "";
      if (node_local._4_4_ != 0) {
        pcVar5 = " ";
      }
      pcVar4 = "";
      if (node_local._4_4_ != 0) {
        pcVar4 = "\n";
      }
      ly_print(out,",%s%*s\"@%s:%s\":%s{%s",pcVar3,(ulong)(uint)(node_local._4_4_ << 1),"",any,
               node->schema->name,pcVar5,pcVar4);
    }
    if (node_local._4_4_ == 0) {
      local_4c = node_local._4_4_;
    }
    else {
      local_4c = node_local._4_4_ + 1;
    }
    json_print_attrs(out,local_4c,node,(lys_module *)0x0);
    ly_print(out,"%*s}",(ulong)(uint)(node_local._4_4_ << 1),"");
  }
  if (node_local._4_4_ != 0) {
    node_local._4_4_ = node_local._4_4_ + -1;
  }
  ly_print(out,"%*s}",(ulong)(uint)(node_local._4_4_ << 1),"");
  return;
}

Assistant:

static void
json_print_anydata(struct lyout *out, int level, const struct lyd_node *node, int toplevel, int options)
{
    const char *schema = NULL;
    struct lyd_node_anydata *any = (struct lyd_node_anydata *)node;

    if (toplevel || !node->parent || nscmp(node, node->parent)) {
        /* print "namespace" */
        schema = lys_node_module(node->schema)->name;
        ly_print(out, "%*s\"%s:%s\":%s{%s", LEVEL, INDENT, schema, node->schema->name, (level ? " " : ""), (level ? "\n" : ""));
    } else {
        ly_print(out, "%*s\"%s\":%s{%s", LEVEL, INDENT, node->schema->name, (level ? " " : ""), (level ? "\n" : ""));
    }
    if (level) {
        level++;
    }

    switch (any->value_type) {
    case LYD_ANYDATA_DATATREE:
        /* do not print any default values nor empty containers */
        json_print_nodes(out, level, any->value.tree, 1, 0,  LYP_WITHSIBLINGS | (options & LYP_FORMAT));
        break;
    case LYD_ANYDATA_JSON:
        if (any->value.str) {
            ly_print(out, "%*s%s%s", LEVEL, INDENT, any->value.str, (level ? "\n" : ""));
        }
        break;
    default:
        /* other formats are not supported */
        LOGWRN("Unable to print anydata content (type %d) as JSON.", any->value_type);
        break;
    }

    /* print attributes as sibling leaf */
    if (node->attr) {
        if (schema) {
            ly_print(out, ",%s%*s\"@%s:%s\":%s{%s", (level ? "\n" : ""), LEVEL, INDENT, schema, node->schema->name,
                     (level ? " " : ""), (level ? "\n" : ""));
        } else {
            ly_print(out, ",%s%*s\"@%s\":%s{%s", (level ? "\n" : ""), LEVEL, INDENT, node->schema->name,
                     (level ? " " : ""), (level ? "\n" : ""));
        }
        json_print_attrs(out, (level ? level + 1 : level), node, NULL);
        ly_print(out, "%*s}", LEVEL, INDENT);
    }


    if (level) {
        level--;
    }
    ly_print(out, "%*s}", LEVEL, INDENT);
}